

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

Span<const_CRPCCommand> wallet::GetWalletRPCCommands(void)

{
  string category;
  string category_00;
  string category_01;
  string category_02;
  string category_03;
  string category_04;
  string category_05;
  string category_06;
  string category_07;
  string category_08;
  string category_09;
  string category_10;
  string category_11;
  string category_12;
  string category_13;
  string category_14;
  string category_15;
  string category_16;
  string category_17;
  string category_18;
  string category_19;
  string category_20;
  string category_21;
  string category_22;
  string category_23;
  string category_24;
  string category_25;
  string category_26;
  string category_27;
  string category_28;
  string category_29;
  string category_30;
  string category_31;
  string category_32;
  string category_33;
  string category_34;
  string category_35;
  string category_36;
  string category_37;
  string category_38;
  string category_39;
  string category_40;
  string category_41;
  string category_42;
  string category_43;
  string category_44;
  string category_45;
  string category_46;
  string category_47;
  string category_48;
  string category_49;
  string category_50;
  string category_51;
  string category_52;
  string category_53;
  string category_54;
  string category_55;
  string category_56;
  string category_57;
  string category_58;
  string category_59;
  string category_60;
  string category_61;
  string category_62;
  string category_63;
  string category_64;
  string category_65;
  string category_66;
  string category_67;
  int iVar1;
  long in_FS_OFFSET;
  Span<const_CRPCCommand> SVar2;
  undefined1 in_stack_fffffffffffff718 [16];
  undefined8 in_stack_fffffffffffff728;
  long *plVar3;
  undefined8 in_stack_fffffffffffff730;
  long local_8c8 [2];
  long *local_8b8 [2];
  long local_8a8 [2];
  long *local_898 [2];
  long local_888 [2];
  long *local_878 [2];
  long local_868 [2];
  long *local_858 [2];
  long local_848 [2];
  long *local_838 [2];
  long local_828 [2];
  long *local_818 [2];
  long local_808 [2];
  long *local_7f8 [2];
  long local_7e8 [2];
  long *local_7d8 [2];
  long local_7c8 [2];
  long *local_7b8 [2];
  long local_7a8 [2];
  long *local_798 [2];
  long local_788 [2];
  long *local_778 [2];
  long local_768 [2];
  long *local_758 [2];
  long local_748 [2];
  long *local_738 [2];
  long local_728 [2];
  long *local_718 [2];
  long local_708 [2];
  long *local_6f8 [2];
  long local_6e8 [2];
  long *local_6d8 [2];
  long local_6c8 [2];
  long *local_6b8 [2];
  long local_6a8 [2];
  long *local_698 [2];
  long local_688 [2];
  long *local_678 [2];
  long local_668 [2];
  long *local_658 [2];
  long local_648 [2];
  long *local_638 [2];
  long local_628 [2];
  long *local_618 [2];
  long local_608 [2];
  long *local_5f8 [2];
  long local_5e8 [2];
  long *local_5d8 [2];
  long local_5c8 [2];
  long *local_5b8 [2];
  long local_5a8 [2];
  long *local_598 [2];
  long local_588 [2];
  long *local_578 [2];
  long local_568 [2];
  long *local_558 [2];
  long local_548 [2];
  long *local_538 [2];
  long local_528 [2];
  long *local_518 [2];
  long local_508 [2];
  long *local_4f8 [2];
  long local_4e8 [2];
  long *local_4d8 [2];
  long local_4c8 [2];
  long *local_4b8 [2];
  long local_4a8 [2];
  long *local_498 [2];
  long local_488 [2];
  long *local_478 [2];
  long local_468 [2];
  long *local_458 [2];
  long local_448 [2];
  long *local_438 [2];
  long local_428 [2];
  long *local_418 [2];
  long local_408 [2];
  long *local_3f8 [2];
  long local_3e8 [2];
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  long *local_398 [2];
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  long *local_358 [2];
  long local_348 [2];
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  long *local_2f8 [2];
  long local_2e8 [2];
  long *local_2d8 [2];
  long local_2c8 [2];
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298 [2];
  long local_288 [2];
  long *local_278 [2];
  long local_268 [2];
  long *local_258 [2];
  long local_248 [2];
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8 [2];
  long local_1a8 [2];
  long *local_198 [2];
  long local_188 [2];
  long *local_178 [2];
  long local_168 [2];
  long *local_158 [2];
  long local_148 [2];
  long *local_138 [2];
  long local_128 [2];
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (GetWalletRPCCommands()::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&GetWalletRPCCommands()::commands);
    if (iVar1 != 0) {
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"rawtransactions","");
      category.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category._M_string_length = in_stack_fffffffffffff718._8_8_;
      category.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand(GetWalletRPCCommands::commands,category,(RpcMethodFnType)local_58);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"wallet","");
      category_00.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_00._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_00.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 1,category_00,(RpcMethodFnType)local_78);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"wallet","");
      category_01.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_01._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_01.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 2,category_01,(RpcMethodFnType)local_98);
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"wallet","");
      category_02.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_02._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_02.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 3,category_02,(RpcMethodFnType)local_b8);
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"wallet","");
      category_03.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_03._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_03.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 4,category_03,(RpcMethodFnType)local_d8);
      local_f8[0] = local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"wallet","");
      category_04.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_04._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_04.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 5,category_04,(RpcMethodFnType)local_f8);
      local_118[0] = local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"wallet","");
      category_05.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_05._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_05.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 6,category_05,(RpcMethodFnType)local_118);
      local_138[0] = local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"wallet","");
      category_06.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_06._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_06.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 7,category_06,(RpcMethodFnType)local_138);
      local_158[0] = local_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"wallet","");
      category_07.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_07._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_07.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 8,category_07,(RpcMethodFnType)local_158);
      local_178[0] = local_168;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"wallet","");
      category_08.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_08._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_08.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 9,category_08,(RpcMethodFnType)local_178);
      local_198[0] = local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"wallet","");
      category_09.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_09._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_09.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 10,category_09,(RpcMethodFnType)local_198);
      local_1b8[0] = local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"wallet","");
      category_10.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_10._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_10._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_10.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0xb,category_10,(RpcMethodFnType)local_1b8);
      local_1d8[0] = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"wallet","");
      category_11.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_11._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_11._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_11.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0xc,category_11,(RpcMethodFnType)local_1d8);
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"wallet","");
      category_12.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_12._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_12._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_12.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0xd,category_12,(RpcMethodFnType)local_1f8);
      local_218[0] = local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"wallet","");
      category_13.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_13._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_13._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_13.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0xe,category_13,(RpcMethodFnType)local_218);
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"wallet","");
      category_14.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_14._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_14._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_14.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0xf,category_14,(RpcMethodFnType)local_238);
      local_258[0] = local_248;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"wallet","");
      category_15.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_15._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_15._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_15.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x10,category_15,(RpcMethodFnType)local_258);
      local_278[0] = local_268;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"wallet","");
      category_16.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_16._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_16._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_16.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x11,category_16,(RpcMethodFnType)local_278);
      local_298[0] = local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"wallet","");
      category_17.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_17._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_17._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_17.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x12,category_17,(RpcMethodFnType)local_298);
      local_2b8[0] = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"wallet","");
      category_18.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_18._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_18._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_18.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x13,category_18,(RpcMethodFnType)local_2b8);
      local_2d8[0] = local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"wallet","");
      category_19.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_19._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_19._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_19.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x14,category_19,(RpcMethodFnType)local_2d8);
      local_2f8[0] = local_2e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"wallet","");
      category_20.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_20._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_20._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_20.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x15,category_20,(RpcMethodFnType)local_2f8);
      local_318[0] = local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"wallet","");
      category_21.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_21._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_21._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_21.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x16,category_21,(RpcMethodFnType)local_318);
      local_338[0] = local_328;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"wallet","");
      category_22.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_22._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_22._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_22.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x17,category_22,(RpcMethodFnType)local_338);
      local_358[0] = local_348;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"wallet","");
      category_23.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_23._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_23._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_23.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x18,category_23,(RpcMethodFnType)local_358);
      local_378[0] = local_368;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"wallet","");
      category_24.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_24._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_24._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_24.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x19,category_24,(RpcMethodFnType)local_378);
      local_398[0] = local_388;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"wallet","");
      category_25.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_25._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_25._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_25.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x1a,category_25,(RpcMethodFnType)local_398);
      local_3b8[0] = local_3a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"wallet","");
      category_26.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_26._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_26._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_26.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x1b,category_26,(RpcMethodFnType)local_3b8);
      local_3d8[0] = local_3c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"wallet","");
      category_27.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_27._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_27._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_27.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x1c,category_27,(RpcMethodFnType)local_3d8);
      local_3f8[0] = local_3e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"wallet","");
      category_28.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_28._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_28._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_28.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x1d,category_28,(RpcMethodFnType)local_3f8);
      local_418[0] = local_408;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"wallet","");
      category_29.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_29._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_29._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_29.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x1e,category_29,(RpcMethodFnType)local_418);
      local_438[0] = local_428;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"wallet","");
      category_30.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_30._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_30._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_30.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x1f,category_30,(RpcMethodFnType)local_438);
      local_458[0] = local_448;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"wallet","");
      category_31.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_31._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_31._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_31.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x20,category_31,(RpcMethodFnType)local_458);
      local_478[0] = local_468;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"wallet","");
      category_32.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_32._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_32._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_32.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x21,category_32,(RpcMethodFnType)local_478);
      local_498[0] = local_488;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"wallet","");
      category_33.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_33._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_33._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_33.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x22,category_33,(RpcMethodFnType)local_498);
      local_4b8[0] = local_4a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"wallet","");
      category_34.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_34._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_34._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_34.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x23,category_34,(RpcMethodFnType)local_4b8);
      local_4d8[0] = local_4c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"wallet","");
      category_35.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_35._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_35._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_35.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x24,category_35,(RpcMethodFnType)local_4d8);
      local_4f8[0] = local_4e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"wallet","");
      category_36.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_36._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_36._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_36.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x25,category_36,(RpcMethodFnType)local_4f8);
      local_518[0] = local_508;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"wallet","");
      category_37.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_37._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_37._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_37.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x26,category_37,(RpcMethodFnType)local_518);
      local_538[0] = local_528;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_538,"wallet","");
      category_38.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_38._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_38._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_38.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x27,category_38,(RpcMethodFnType)local_538);
      local_558[0] = local_548;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"wallet","");
      category_39.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_39._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_39._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_39.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x28,category_39,(RpcMethodFnType)local_558);
      local_578[0] = local_568;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"wallet","");
      category_40.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_40._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_40._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_40.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x29,category_40,(RpcMethodFnType)local_578);
      local_598[0] = local_588;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"wallet","");
      category_41.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_41._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_41._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_41.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x2a,category_41,(RpcMethodFnType)local_598);
      local_5b8[0] = local_5a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"wallet","");
      category_42.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_42._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_42._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_42.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x2b,category_42,(RpcMethodFnType)local_5b8);
      local_5d8[0] = local_5c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"wallet","");
      category_43.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_43._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_43._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_43.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x2c,category_43,(RpcMethodFnType)local_5d8);
      local_5f8[0] = local_5e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"wallet","");
      category_44.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_44._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_44._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_44.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x2d,category_44,(RpcMethodFnType)local_5f8);
      local_618[0] = local_608;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"wallet","");
      category_45.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_45._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_45._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_45.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x2e,category_45,(RpcMethodFnType)local_618);
      local_638[0] = local_628;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_638,"wallet","");
      category_46.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_46._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_46._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_46.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x2f,category_46,(RpcMethodFnType)local_638);
      local_658[0] = local_648;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"wallet","");
      category_47.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_47._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_47._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_47.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x30,category_47,(RpcMethodFnType)local_658);
      local_678[0] = local_668;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"wallet","");
      category_48.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_48._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_48._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_48.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x31,category_48,(RpcMethodFnType)local_678);
      local_698[0] = local_688;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"wallet","");
      category_49.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_49._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_49._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_49.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x32,category_49,(RpcMethodFnType)local_698);
      local_6b8[0] = local_6a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6b8,"wallet","");
      category_50.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_50._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_50._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_50.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x33,category_50,(RpcMethodFnType)local_6b8);
      local_6d8[0] = local_6c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"wallet","");
      category_51.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_51._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_51._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_51.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x34,category_51,(RpcMethodFnType)local_6d8);
      local_6f8[0] = local_6e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"wallet","");
      category_52.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_52._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_52._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_52.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x35,category_52,(RpcMethodFnType)local_6f8);
      local_718[0] = local_708;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"wallet","");
      category_53.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_53._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_53._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_53.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x36,category_53,(RpcMethodFnType)local_718);
      local_738[0] = local_728;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_738,"wallet","");
      category_54.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_54._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_54._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_54.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x37,category_54,(RpcMethodFnType)local_738);
      local_758[0] = local_748;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"wallet","");
      category_55.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_55._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_55._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_55.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x38,category_55,(RpcMethodFnType)local_758);
      local_778[0] = local_768;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_778,"wallet","");
      category_56.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_56._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_56._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_56.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x39,category_56,(RpcMethodFnType)local_778);
      local_798[0] = local_788;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_798,"wallet","");
      category_57.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_57._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_57._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_57.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x3a,category_57,(RpcMethodFnType)local_798);
      local_7b8[0] = local_7a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7b8,"wallet","");
      category_58.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_58._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_58._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_58.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x3b,category_58,(RpcMethodFnType)local_7b8);
      local_7d8[0] = local_7c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7d8,"wallet","");
      category_59.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_59._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_59._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_59.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x3c,category_59,(RpcMethodFnType)local_7d8);
      local_7f8[0] = local_7e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7f8,"wallet","");
      category_60.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_60._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_60._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_60.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x3d,category_60,(RpcMethodFnType)local_7f8);
      local_818[0] = local_808;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_818,"wallet","");
      category_61.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_61._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_61._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_61.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x3e,category_61,(RpcMethodFnType)local_818);
      local_838[0] = local_828;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"wallet","");
      category_62.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_62._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_62._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_62.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x3f,category_62,(RpcMethodFnType)local_838);
      local_858[0] = local_848;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_858,"wallet","");
      category_63.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_63._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_63._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_63.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x40,category_63,(RpcMethodFnType)local_858);
      local_878[0] = local_868;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_878,"wallet","");
      category_64.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_64._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_64._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_64.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x41,category_64,(RpcMethodFnType)local_878);
      local_898[0] = local_888;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_898,"wallet","");
      category_65.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_65._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_65._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_65.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x42,category_65,(RpcMethodFnType)local_898);
      local_8b8[0] = local_8a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_8b8,"wallet","");
      category_66.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
      category_66._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_66._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_66.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x43,category_66,(RpcMethodFnType)local_8b8);
      plVar3 = local_8c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffff728,"wallet","");
      category_67.field_2._M_allocated_capacity = (size_type)plVar3;
      category_67._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718._0_8_;
      category_67._M_string_length = in_stack_fffffffffffff718._8_8_;
      category_67.field_2._8_8_ = in_stack_fffffffffffff730;
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x44,category_67,
                 (RpcMethodFnType)&stack0xfffffffffffff728);
      if (plVar3 != local_8c8) {
        operator_delete(plVar3,local_8c8[0] + 1);
      }
      if (local_8b8[0] != local_8a8) {
        operator_delete(local_8b8[0],local_8a8[0] + 1);
      }
      if (local_898[0] != local_888) {
        operator_delete(local_898[0],local_888[0] + 1);
      }
      if (local_878[0] != local_868) {
        operator_delete(local_878[0],local_868[0] + 1);
      }
      if (local_858[0] != local_848) {
        operator_delete(local_858[0],local_848[0] + 1);
      }
      if (local_838[0] != local_828) {
        operator_delete(local_838[0],local_828[0] + 1);
      }
      if (local_818[0] != local_808) {
        operator_delete(local_818[0],local_808[0] + 1);
      }
      if (local_7f8[0] != local_7e8) {
        operator_delete(local_7f8[0],local_7e8[0] + 1);
      }
      if (local_7d8[0] != local_7c8) {
        operator_delete(local_7d8[0],local_7c8[0] + 1);
      }
      if (local_7b8[0] != local_7a8) {
        operator_delete(local_7b8[0],local_7a8[0] + 1);
      }
      if (local_798[0] != local_788) {
        operator_delete(local_798[0],local_788[0] + 1);
      }
      if (local_778[0] != local_768) {
        operator_delete(local_778[0],local_768[0] + 1);
      }
      if (local_758[0] != local_748) {
        operator_delete(local_758[0],local_748[0] + 1);
      }
      if (local_738[0] != local_728) {
        operator_delete(local_738[0],local_728[0] + 1);
      }
      if (local_718[0] != local_708) {
        operator_delete(local_718[0],local_708[0] + 1);
      }
      if (local_6f8[0] != local_6e8) {
        operator_delete(local_6f8[0],local_6e8[0] + 1);
      }
      if (local_6d8[0] != local_6c8) {
        operator_delete(local_6d8[0],local_6c8[0] + 1);
      }
      if (local_6b8[0] != local_6a8) {
        operator_delete(local_6b8[0],local_6a8[0] + 1);
      }
      if (local_698[0] != local_688) {
        operator_delete(local_698[0],local_688[0] + 1);
      }
      if (local_678[0] != local_668) {
        operator_delete(local_678[0],local_668[0] + 1);
      }
      if (local_658[0] != local_648) {
        operator_delete(local_658[0],local_648[0] + 1);
      }
      if (local_638[0] != local_628) {
        operator_delete(local_638[0],local_628[0] + 1);
      }
      if (local_618[0] != local_608) {
        operator_delete(local_618[0],local_608[0] + 1);
      }
      if (local_5f8[0] != local_5e8) {
        operator_delete(local_5f8[0],local_5e8[0] + 1);
      }
      if (local_5d8[0] != local_5c8) {
        operator_delete(local_5d8[0],local_5c8[0] + 1);
      }
      if (local_5b8[0] != local_5a8) {
        operator_delete(local_5b8[0],local_5a8[0] + 1);
      }
      if (local_598[0] != local_588) {
        operator_delete(local_598[0],local_588[0] + 1);
      }
      if (local_578[0] != local_568) {
        operator_delete(local_578[0],local_568[0] + 1);
      }
      if (local_558[0] != local_548) {
        operator_delete(local_558[0],local_548[0] + 1);
      }
      if (local_538[0] != local_528) {
        operator_delete(local_538[0],local_528[0] + 1);
      }
      if (local_518[0] != local_508) {
        operator_delete(local_518[0],local_508[0] + 1);
      }
      if (local_4f8[0] != local_4e8) {
        operator_delete(local_4f8[0],local_4e8[0] + 1);
      }
      if (local_4d8[0] != local_4c8) {
        operator_delete(local_4d8[0],local_4c8[0] + 1);
      }
      if (local_4b8[0] != local_4a8) {
        operator_delete(local_4b8[0],local_4a8[0] + 1);
      }
      if (local_498[0] != local_488) {
        operator_delete(local_498[0],local_488[0] + 1);
      }
      if (local_478[0] != local_468) {
        operator_delete(local_478[0],local_468[0] + 1);
      }
      if (local_458[0] != local_448) {
        operator_delete(local_458[0],local_448[0] + 1);
      }
      if (local_438[0] != local_428) {
        operator_delete(local_438[0],local_428[0] + 1);
      }
      if (local_418[0] != local_408) {
        operator_delete(local_418[0],local_408[0] + 1);
      }
      if (local_3f8[0] != local_3e8) {
        operator_delete(local_3f8[0],local_3e8[0] + 1);
      }
      if (local_3d8[0] != local_3c8) {
        operator_delete(local_3d8[0],local_3c8[0] + 1);
      }
      if (local_3b8[0] != local_3a8) {
        operator_delete(local_3b8[0],local_3a8[0] + 1);
      }
      if (local_398[0] != local_388) {
        operator_delete(local_398[0],local_388[0] + 1);
      }
      if (local_378[0] != local_368) {
        operator_delete(local_378[0],local_368[0] + 1);
      }
      if (local_358[0] != local_348) {
        operator_delete(local_358[0],local_348[0] + 1);
      }
      if (local_338[0] != local_328) {
        operator_delete(local_338[0],local_328[0] + 1);
      }
      if (local_318[0] != local_308) {
        operator_delete(local_318[0],local_308[0] + 1);
      }
      if (local_2f8[0] != local_2e8) {
        operator_delete(local_2f8[0],local_2e8[0] + 1);
      }
      if (local_2d8[0] != local_2c8) {
        operator_delete(local_2d8[0],local_2c8[0] + 1);
      }
      if (local_2b8[0] != local_2a8) {
        operator_delete(local_2b8[0],local_2a8[0] + 1);
      }
      if (local_298[0] != local_288) {
        operator_delete(local_298[0],local_288[0] + 1);
      }
      if (local_278[0] != local_268) {
        operator_delete(local_278[0],local_268[0] + 1);
      }
      if (local_258[0] != local_248) {
        operator_delete(local_258[0],local_248[0] + 1);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0],local_228[0] + 1);
      }
      if (local_218[0] != local_208) {
        operator_delete(local_218[0],local_208[0] + 1);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0],local_1a8[0] + 1);
      }
      if (local_198[0] != local_188) {
        operator_delete(local_198[0],local_188[0] + 1);
      }
      if (local_178[0] != local_168) {
        operator_delete(local_178[0],local_168[0] + 1);
      }
      if (local_158[0] != local_148) {
        operator_delete(local_158[0],local_148[0] + 1);
      }
      if (local_138[0] != local_128) {
        operator_delete(local_138[0],local_128[0] + 1);
      }
      if (local_118[0] != local_108) {
        operator_delete(local_118[0],local_108[0] + 1);
      }
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0],local_e8[0] + 1);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0],local_c8[0] + 1);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      __cxa_atexit(::__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&GetWalletRPCCommands()::commands);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    SVar2.m_size = 0x45;
    SVar2.m_data = GetWalletRPCCommands::commands;
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

Span<const CRPCCommand> GetWalletRPCCommands()
{
    static const CRPCCommand commands[]{
        {"rawtransactions", &fundrawtransaction},
        {"wallet", &abandontransaction},
        {"wallet", &abortrescan},
        {"wallet", &addmultisigaddress},
        {"wallet", &backupwallet},
        {"wallet", &bumpfee},
        {"wallet", &psbtbumpfee},
        {"wallet", &createwallet},
        {"wallet", &createwalletdescriptor},
        {"wallet", &restorewallet},
        {"wallet", &dumpprivkey},
        {"wallet", &dumpwallet},
        {"wallet", &encryptwallet},
        {"wallet", &getaddressesbylabel},
        {"wallet", &getaddressinfo},
        {"wallet", &getbalance},
        {"wallet", &gethdkeys},
        {"wallet", &getnewaddress},
        {"wallet", &getrawchangeaddress},
        {"wallet", &getreceivedbyaddress},
        {"wallet", &getreceivedbylabel},
        {"wallet", &gettransaction},
        {"wallet", &getunconfirmedbalance},
        {"wallet", &getbalances},
        {"wallet", &getwalletinfo},
        {"wallet", &importaddress},
        {"wallet", &importdescriptors},
        {"wallet", &importmulti},
        {"wallet", &importprivkey},
        {"wallet", &importprunedfunds},
        {"wallet", &importpubkey},
        {"wallet", &importwallet},
        {"wallet", &keypoolrefill},
        {"wallet", &listaddressgroupings},
        {"wallet", &listdescriptors},
        {"wallet", &listlabels},
        {"wallet", &listlockunspent},
        {"wallet", &listreceivedbyaddress},
        {"wallet", &listreceivedbylabel},
        {"wallet", &listsinceblock},
        {"wallet", &listtransactions},
        {"wallet", &listunspent},
        {"wallet", &listwalletdir},
        {"wallet", &listwallets},
        {"wallet", &loadwallet},
        {"wallet", &lockunspent},
        {"wallet", &migratewallet},
        {"wallet", &newkeypool},
        {"wallet", &removeprunedfunds},
        {"wallet", &rescanblockchain},
        {"wallet", &send},
        {"wallet", &sendmany},
        {"wallet", &sendtoaddress},
        {"wallet", &sethdseed},
        {"wallet", &setlabel},
        {"wallet", &settxfee},
        {"wallet", &setwalletflag},
        {"wallet", &signmessage},
        {"wallet", &signrawtransactionwithwallet},
        {"wallet", &simulaterawtransaction},
        {"wallet", &sendall},
        {"wallet", &unloadwallet},
        {"wallet", &upgradewallet},
        {"wallet", &walletcreatefundedpsbt},
#ifdef ENABLE_EXTERNAL_SIGNER
        {"wallet", &walletdisplayaddress},
#endif // ENABLE_EXTERNAL_SIGNER
        {"wallet", &walletlock},
        {"wallet", &walletpassphrase},
        {"wallet", &walletpassphrasechange},
        {"wallet", &walletprocesspsbt},
    };
    return commands;
}